

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void __thiscall VmFunction::MoveEntryBlockToStart(VmFunction *this)

{
  VmBlock **ppVVar1;
  VmBlock *pVVar2;
  ulong uVar3;
  VmBlock *pVVar4;
  VmBlock *pVVar5;
  ulong uVar6;
  VmBlock *curr;
  VmBlock *block;
  
  pVVar2 = this->firstBlock;
  block = pVVar2;
  if (pVVar2 == (VmBlock *)0x0) {
    return;
  }
  do {
    uVar3 = (ulong)(block->super_VmValue).users.count;
    if (uVar3 != 0) {
      uVar6 = 0;
      do {
        if ((VmFunction *)(block->super_VmValue).users.data[uVar6] == this) {
          if (pVVar2 == block) {
            return;
          }
          DetachBlock(this,block);
          pVVar2 = this->firstBlock;
          pVVar4 = (VmBlock *)this;
          pVVar5 = block;
          if (pVVar2 != (VmBlock *)0x0) {
            pVVar2->prevSibling = block;
            pVVar4 = block;
            pVVar5 = pVVar2;
          }
          pVVar4->nextSibling = pVVar5;
          this->firstBlock = block;
          block->parent = this;
          return;
        }
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
    ppVVar1 = &block->nextSibling;
    block = *ppVVar1;
  } while (*ppVVar1 != (VmBlock *)0x0);
  __assert_fail("entryBlock",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x86b,"void VmFunction::MoveEntryBlockToStart()");
}

Assistant:

void VmFunction::MoveEntryBlockToStart()
{
	if(!firstBlock)
		return;

	// Function must start from the first block
	VmBlock *entryBlock = NULL;

	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
	{
		for(unsigned i = 0; i < curr->users.size(); i++)
		{
			if(curr->users[i] == this)
			{
				entryBlock = curr;
				break;
			}
		}

		if(entryBlock)
			break;
	}

	assert(entryBlock);

	if(firstBlock != entryBlock)
	{
		// Detach entry block
		DetachBlock(entryBlock);

		// Re-attach to front
		if(!firstBlock)
		{
			firstBlock = lastBlock = entryBlock;
		}
		else
		{
			firstBlock->prevSibling = entryBlock;
			entryBlock->nextSibling = firstBlock;
			firstBlock = entryBlock;
		}

		entryBlock->parent = this;
	}
}